

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O3

int ABC_Check_Integrity(ABC_Manager mng)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  pVVar1 = mng->pNtk->vObjs;
  lVar5 = (long)pVVar1->nSize;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar6];
      if ((((pvVar2 != (void *)0x0) && (lVar6 != 0)) &&
          ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) && (*(int *)((long)pvVar2 + 0x2c) == 0))
      goto LAB_004ffd52;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  iVar3 = Abc_NtkDoCheck(mng->pNtk);
  iVar4 = 1;
  if (iVar3 == 0) {
    puts("ABC_Check_Integrity: The internal network check has failed.");
LAB_004ffd52:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int ABC_Check_Integrity( ABC_Manager mng )
{
    Abc_Ntk_t * pNtk = mng->pNtk;
    Abc_Obj_t * pObj;
    int i;

    // check that there are no dangling nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) 
            continue;
        if ( Abc_ObjFanoutNum(pObj) == 0 )
        {
//            printf( "ABC_Check_Integrity: The network has dangling nodes.\n" );
            return 0;
        }
    }

    // make sure everything is okay with the network structure
    if ( !Abc_NtkDoCheck( pNtk ) )
    {
        printf( "ABC_Check_Integrity: The internal network check has failed.\n" );
        return 0;
    }
    return 1;
}